

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetPropertyInternal(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  byte bVar1;
  JSShape *pJVar2;
  JSClassExoticMethods *pJVar3;
  _func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_int *p_Var4;
  _func_int_JSContext_ptr_JSPropertyDescriptor_ptr_JSValue_JSAtom *p_Var5;
  JSValue getter;
  JSValue getter_00;
  JSValue setter;
  JSValue setter_00;
  int iVar6;
  int iVar7;
  int iVar8;
  JSToNumberHintEnum flag;
  ulong uVar9;
  JSValueUnion *pJVar10;
  uint uVar11;
  void *pvVar12;
  char *pcVar13;
  JSValueUnion JVar14;
  JSValueUnion JVar16;
  JSObject **ppJVar17;
  void *pvVar18;
  JSRefCountHeader *p;
  JSValue JVar19;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar20;
  JSValue JVar21;
  JSPropertyDescriptor desc;
  JSValueUnion local_d8;
  int *local_a8;
  JSValue local_a0;
  JSValue local_90;
  JSValueUnion local_80;
  int local_78;
  undefined4 uStack_74;
  undefined4 local_70;
  uint uStack_6c;
  undefined8 uStack_68;
  undefined4 local_60;
  uint uStack_5c;
  undefined8 uStack_58;
  undefined4 local_50;
  uint uStack_4c;
  undefined8 uStack_48;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  JSValueUnion JVar15;
  
  pvVar18 = (void *)val.tag;
  JVar16 = val.u;
  JVar20.tag = (JSValueUnion)this_obj.tag;
  JVar14 = this_obj.u;
  iVar8 = (int)this_obj.tag;
  if (iVar8 == -1) {
    iVar8 = 0x3ffffff;
    do {
      pJVar2 = *(JSShape **)((long)JVar14.ptr + 0x18);
      uVar11 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
      if (uVar11 == 0) {
        pJVar10 = (JSValueUnion *)0x0;
        ppJVar17 = (JSObject **)0x0;
      }
      else {
        do {
          uVar9 = (ulong)uVar11;
          ppJVar17 = &pJVar2->proto + uVar9;
          if (*(JSAtom *)((long)&pJVar2->proto + uVar9 * 8 + 4) == prop) {
            pJVar10 = (JSValueUnion *)(*(JSProperty **)((long)JVar14.ptr + 0x20) + (uVar9 - 1));
            break;
          }
          uVar11 = *(uint *)ppJVar17;
          pJVar10 = (JSValueUnion *)0x0;
          ppJVar17 = (JSObject **)0x0;
          uVar11 = uVar11 & 0x3ffffff;
        } while (uVar11 != 0);
      }
      local_d8 = JVar14;
      if (ppJVar17 == (JSObject **)0x0) goto LAB_0011fac4;
      uVar11 = *(uint *)ppJVar17;
      if ((uVar11 & 0xe8000000) == 0x8000000) {
        local_a8 = (int *)pJVar10->ptr;
        JVar14 = pJVar10[1];
        JVar20 = *(JSValue *)pJVar10;
        pJVar10->ptr = (void *)JVar16;
        pJVar10[1].ptr = pvVar18;
        if ((uint)JVar14.int32 < 0xfffffff5) {
          return 1;
        }
        iVar8 = *local_a8;
        *local_a8 = iVar8 + -1;
        if (1 < iVar8) {
          return 1;
        }
        __JS_FreeValueRT(ctx->rt,JVar20);
        return 1;
      }
      if ((uVar11 >> 0x1d & 1) != 0) {
        iVar8 = set_array_length(ctx,(JSObject *)JVar14.ptr,val,flags);
        return iVar8;
      }
      if (uVar11 >> 0x1e != 3) {
        if (uVar11 >> 0x1e != 0) {
          if (uVar11 >> 0x1e != 2) {
            iVar8 = call_setter(ctx,(JSObject *)pJVar10[1].ptr,this_obj,val,flags);
            return iVar8;
          }
          if (*(short *)((long)JVar14.ptr + 6) != 0xb) {
            set_value(ctx,*(JSValue **)((long)pJVar10->ptr + 0x18),val);
            return 1;
          }
        }
        goto LAB_0011fe22;
      }
      iVar6 = JS_AutoInitProperty(ctx,(JSObject *)JVar14.ptr,prop,(JSProperty *)pJVar10,
                                  (JSShapeProperty *)ppJVar17);
    } while (iVar6 == 0);
LAB_0011fbbf:
    JS_FreeValue(ctx,val);
  }
  else {
    if (iVar8 == 3) {
      JS_FreeValue(ctx,val);
      pcVar13 = "cannot set property \'%s\' of undefined";
    }
    else {
      if (iVar8 != 2) {
        JVar20.u.ptr = (void *)JVar20.tag;
        JVar20 = JS_GetPrototypePrimitive(ctx,JVar20);
        JVar14 = JVar20.u;
        local_d8.float64 = 0.0;
        iVar8 = flags;
        goto LAB_0011fd44;
      }
      JS_FreeValue(ctx,val);
      pcVar13 = "cannot set property \'%s\' of null";
    }
    __JS_ThrowTypeErrorAtom(ctx,prop,pcVar13);
  }
  return -1;
LAB_0011fddf:
  if (uVar11 == 0x10) {
    iVar8 = call_setter(ctx,(JSObject *)pJVar10[1].ptr,this_obj,val,flags);
    return iVar8;
  }
  if ((*(uint *)ppJVar17 >> 0x1b & 1) == 0) {
LAB_0011fe22:
    JS_FreeValue(ctx,val);
    iVar8 = JS_ThrowTypeErrorReadOnly(ctx,flags,prop);
    return iVar8;
  }
LAB_0011fac4:
  flag = (JSToNumberHintEnum)pJVar10;
  if ((*(byte *)((long)JVar14.ptr + 5) & 4) != 0) {
    if ((*(byte *)((long)JVar14.ptr + 5) & 8) == 0) {
      pJVar3 = ctx->rt->class_array[*(ushort *)((long)JVar14.ptr + 6)].exotic;
      iVar6 = 0;
      if (pJVar3 != (JSClassExoticMethods *)0x0) {
        p_Var4 = pJVar3->set_property;
        pvVar12 = pvVar18;
        JVar15 = JVar16;
        if (p_Var4 != (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_int *)0x0) {
          *(int *)JVar14.ptr = *JVar14.ptr + 1;
          JVar19.tag = -1;
          JVar19.u.ptr = JVar14.ptr;
          iVar8 = (*p_Var4)(ctx,JVar19,prop,val,this_obj,flags);
          v.tag = -1;
          v.u.ptr = JVar14.ptr;
          JS_FreeValue(ctx,v);
          goto LAB_0011fb4e;
        }
        p_Var5 = pJVar3->get_own_property;
        if (p_Var5 != (_func_int_JSContext_ptr_JSPropertyDescriptor_ptr_JSValue_JSAtom *)0x0) {
          *(int *)JVar14.ptr = *JVar14.ptr + 1;
          JVar21.tag = -1;
          JVar21.u.ptr = JVar14.ptr;
          iVar7 = (*p_Var5)(ctx,(JSPropertyDescriptor *)&local_a8,JVar21,prop);
          v_01.tag = -1;
          v_01.u.ptr = JVar14.ptr;
          JS_FreeValue(ctx,v_01);
          if (iVar7 < 0) {
            JS_FreeValue(ctx,val);
            iVar6 = 1;
            iVar8 = iVar7;
          }
          else {
            iVar6 = 0;
            if (iVar7 != 0) {
              if (((ulong)local_a8 & 0x10) == 0) {
                JS_FreeValue(ctx,local_a0);
                iVar6 = 5;
                if ((((ulong)local_a8 & 2) == 0) || (iVar6 = 6, local_d8.ptr != JVar14.ptr))
                goto LAB_0011fb5d;
                local_40 = 0;
                uStack_38 = 3;
                local_50 = 0;
                uStack_48 = 3;
                getter.tag = 3;
                getter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
                setter.tag = 3;
                setter.u.ptr = (void *)((ulong)uStack_4c << 0x20);
                iVar8 = JS_DefineProperty(ctx,this_obj,prop,val,getter,setter,0x2000);
              }
              else {
                JVar15.float64 = 0.0;
                if (local_78 != 3) {
                  JVar15 = local_80;
                }
                iVar8 = call_setter(ctx,(JSObject *)JVar15.ptr,this_obj,val,flags);
                JS_FreeValue(ctx,local_90);
                pvVar12 = (void *)CONCAT44(uStack_74,local_78);
                JVar15 = local_80;
              }
LAB_0011fb4e:
              v_00.tag = (int64_t)pvVar12;
              v_00.u.ptr = JVar15.ptr;
              JS_FreeValue(ctx,v_00);
              iVar6 = 1;
            }
          }
        }
      }
LAB_0011fb5d:
      if (iVar6 == 0) goto LAB_0011fd3c;
      if (iVar6 == 5) goto LAB_0011fe22;
      if (iVar6 != 6) {
        return iVar8;
      }
      goto LAB_0011fec1;
    }
    if ((int)prop < 0) {
      flag = prop & 0x7fffffff;
      if (flag < *(JSToNumberHintEnum *)((long)JVar14.ptr + 0x40)) {
        iVar6 = 6;
        if (local_d8.ptr == JVar14.ptr) {
          iVar8 = JS_SetPropertyValue(ctx,this_obj,(JSValue)ZEXT416(flag),val,flags);
          iVar6 = 1;
        }
      }
      else {
        flag = *(ushort *)((long)JVar14.ptr + 6) - 0x15;
        iVar6 = (uint)((ushort)flag < 9) << 3;
      }
      if (iVar6 != 0) {
        if (iVar6 != 6) {
          if (iVar6 != 8) {
            return iVar8;
          }
          goto LAB_0011fe71;
        }
        goto LAB_0011fec1;
      }
    }
    else {
      if (8 < (ushort)(*(short *)((long)JVar14.ptr + 6) - 0x15U)) goto LAB_0011fd3c;
      iVar6 = JS_AtomIsNumericIndex(ctx,prop);
      if (iVar6 != 0) {
        if (-1 < iVar6) {
LAB_0011fe71:
          JVar20 = JS_ToNumberHintFree(ctx,val,flag);
          JS_FreeValue(ctx,JVar20);
          if ((int)JVar20.tag == 6) {
            return -1;
          }
          pcVar13 = "out-of-bound numeric index";
          goto LAB_0011feb5;
        }
        goto LAB_0011fbbf;
      }
    }
  }
LAB_0011fd3c:
  JVar14 = (JSValueUnion)(*(JSShape **)((long)JVar14.ptr + 0x18))->proto;
LAB_0011fd44:
  if ((JSObject *)JVar14.ptr != (JSObject *)0x0) {
    do {
      pJVar2 = *(JSShape **)((long)JVar14.ptr + 0x18);
      uVar11 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
      if (uVar11 == 0) {
        pJVar10 = (JSValueUnion *)0x0;
        ppJVar17 = (JSObject **)0x0;
      }
      else {
        do {
          uVar9 = (ulong)uVar11;
          ppJVar17 = &pJVar2->proto + uVar9;
          if (*(JSAtom *)((long)&pJVar2->proto + uVar9 * 8 + 4) == prop) {
            pJVar10 = (JSValueUnion *)(*(JSProperty **)((long)JVar14.ptr + 0x20) + (uVar9 - 1));
            break;
          }
          uVar11 = *(uint *)ppJVar17;
          pJVar10 = (JSValueUnion *)0x0;
          ppJVar17 = (JSObject **)0x0;
          uVar11 = uVar11 & 0x3ffffff;
        } while (uVar11 != 0);
      }
      if (ppJVar17 == (JSObject **)0x0) goto LAB_0011fac4;
      uVar11 = *(uint *)ppJVar17 >> 0x1a & 0xfffffff0;
      if (uVar11 != 0x30) goto LAB_0011fddf;
      iVar6 = JS_AutoInitProperty(ctx,(JSObject *)JVar14.ptr,prop,(JSProperty *)pJVar10,
                                  (JSShapeProperty *)ppJVar17);
      if (iVar6 != 0) {
        return -1;
      }
    } while( true );
  }
LAB_0011fec1:
  if (((uint)flags >> 0x10 & 1) != 0) {
    JS_FreeValue(ctx,val);
    JS_ThrowReferenceErrorNotDefined(ctx,prop);
    return -1;
  }
  if (local_d8.ptr == (void *)0x0) {
    JS_FreeValue(ctx,val);
    pcVar13 = "not an object";
  }
  else {
    bVar1 = *(byte *)((long)local_d8.ptr + 5);
    if ((bVar1 & 1) != 0) {
      if ((bVar1 & 4) != 0) {
        if (((((int)prop < 0) && ((bVar1 & 8) != 0)) && (*(short *)((long)local_d8.ptr + 6) == 2))
           && ((prop & 0x7fffffff) == *(uint *)((long)local_d8.ptr + 0x40))) {
          iVar8 = add_fast_array_element(ctx,(JSObject *)local_d8.ptr,val,flags);
          return iVar8;
        }
        local_60 = 0;
        uStack_58 = 3;
        local_70 = 0;
        uStack_68 = 3;
        getter_00.tag = 3;
        getter_00.u.ptr = (void *)((ulong)uStack_5c << 0x20);
        setter_00.tag = 3;
        setter_00.u.ptr = (void *)((ulong)uStack_6c << 0x20);
        iVar8 = JS_CreateProperty(ctx,(JSObject *)local_d8.ptr,prop,val,getter_00,setter_00,
                                  flags | 0x2707);
        JS_FreeValue(ctx,val);
        return iVar8;
      }
      pJVar10 = (JSValueUnion *)add_property(ctx,(JSObject *)local_d8.ptr,prop,7);
      if (pJVar10 != (JSValueUnion *)0x0) {
        pJVar10->ptr = (void *)JVar16;
        pJVar10[1].ptr = pvVar18;
        return 1;
      }
      goto LAB_0011fbbf;
    }
    JS_FreeValue(ctx,val);
    pcVar13 = "object is not extensible";
  }
LAB_0011feb5:
  iVar8 = JS_ThrowTypeErrorOrFalse(ctx,flags,pcVar13);
  return iVar8;
}

Assistant:

int JS_SetPropertyInternal(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    JSObject *p, *p1;
    JSShapeProperty *prs;
    JSProperty *pr;
    uint32_t tag;
    JSPropertyDescriptor desc;
    int ret;
#if 0
    printf("JS_SetPropertyInternal: "); print_atom(ctx, prop); printf("\n");
#endif
    tag = JS_VALUE_GET_TAG(this_obj);
    if (unlikely(tag != JS_TAG_OBJECT)) {
        switch(tag) {
        case JS_TAG_NULL:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of null", prop);
            return -1;
        case JS_TAG_UNDEFINED:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of undefined", prop);
            return -1;
        default:
            /* even on a primitive type we can have setters on the prototype */
            p = NULL;
            p1 = JS_VALUE_GET_OBJ(JS_GetPrototypePrimitive(ctx, this_obj));
            goto prototype_lookup;
        }
    }
    p = JS_VALUE_GET_OBJ(this_obj);
retry:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        if (likely((prs->flags & (JS_PROP_TMASK | JS_PROP_WRITABLE |
                                  JS_PROP_LENGTH)) == JS_PROP_WRITABLE)) {
            /* fast case */
            set_value(ctx, &pr->u.value, val);
            return TRUE;
        } else if (prs->flags & JS_PROP_LENGTH) {
            assert(p->class_id == JS_CLASS_ARRAY);
            assert(prop == JS_ATOM_length);
            return set_array_length(ctx, p, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
            return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
            /* JS_PROP_WRITABLE is always true for variable
               references, but they are write protected in module name
               spaces. */
            if (p->class_id == JS_CLASS_MODULE_NS)
                goto read_only_prop;
            set_value(ctx, pr->u.var_ref->pvalue, val);
            return TRUE;
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry (potentially useless) */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs)) {
                JS_FreeValue(ctx, val);
                return -1;
            }
            goto retry;
        } else {
            goto read_only_prop;
        }
    }

    p1 = p;
    for(;;) {
        if (p1->is_exotic) {
            if (p1->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    uint32_t idx = __JS_AtomToUInt32(prop);
                    if (idx < p1->u.array.count) {
                        if (unlikely(p == p1))
                            return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), val, flags);
                        else
                            break;
                    } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                               p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                        goto typed_array_oob;
                    }
                } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                           p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_AtomIsNumericIndex(ctx, prop);
                    if (ret != 0) {
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return -1;
                        }
                    typed_array_oob:
                        val = JS_ToNumberFree(ctx, val);
                        JS_FreeValue(ctx, val);
                        if (JS_IsException(val))
                            return -1;
                        return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
                    }
                }
            } else {
                const JSClassExoticMethods *em = ctx->rt->class_array[p1->class_id].exotic;
                if (em) {
                    JSValue obj1;
                    if (em->set_property) {
                        /* set_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->set_property(ctx, obj1, prop,
                                               val, this_obj, flags);
                        JS_FreeValue(ctx, obj1);
                        JS_FreeValue(ctx, val);
                        return ret;
                    }
                    if (em->get_own_property) {
                        /* get_own_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->get_own_property(ctx, &desc,
                                                   obj1, prop);
                        JS_FreeValue(ctx, obj1);
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return ret;
                        }
                        if (ret) {
                            if (desc.flags & JS_PROP_GETSET) {
                                JSObject *setter;
                                if (JS_IsUndefined(desc.setter))
                                    setter = NULL;
                                else
                                    setter = JS_VALUE_GET_OBJ(desc.setter);
                                ret = call_setter(ctx, setter, this_obj, val, flags);
                                JS_FreeValue(ctx, desc.getter);
                                JS_FreeValue(ctx, desc.setter);
                                return ret;
                            } else {
                                JS_FreeValue(ctx, desc.value);
                                if (!(desc.flags & JS_PROP_WRITABLE))
                                    goto read_only_prop;
                                if (likely(p == p1)) {
                                    ret = JS_DefineProperty(ctx, this_obj, prop, val,
                                                            JS_UNDEFINED, JS_UNDEFINED,
                                                            JS_PROP_HAS_VALUE);
                                    JS_FreeValue(ctx, val);
                                    return ret;
                                } else {
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
        p1 = p1->shape->proto;
    prototype_lookup:
        if (!p1)
            break;

    retry2:
        prs = find_own_property(&pr, p1, prop);
        if (prs) {
            if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
            } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
                /* Instantiate property and retry (potentially useless) */
                if (JS_AutoInitProperty(ctx, p1, prop, pr, prs))
                    return -1;
                goto retry2;
            } else if (!(prs->flags & JS_PROP_WRITABLE)) {
            read_only_prop:
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, flags, prop);
            }
        }
    }

    if (unlikely(flags & JS_PROP_NO_ADD)) {
        JS_FreeValue(ctx, val);
        JS_ThrowReferenceErrorNotDefined(ctx, prop);
        return -1;
    }

    if (unlikely(!p)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "not an object");
    }

    if (unlikely(!p->extensible)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY && p->fast_array &&
            __JS_AtomIsTaggedInt(prop)) {
            uint32_t idx = __JS_AtomToUInt32(prop);
            if (idx == p->u.array.count) {
                /* fast case */
                return add_fast_array_element(ctx, p, val, flags);
            } else {
                goto generic_create_prop;
            }
        } else {
        generic_create_prop:
            ret = JS_CreateProperty(ctx, p, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                                    flags |
                                    JS_PROP_HAS_VALUE |
                                    JS_PROP_HAS_ENUMERABLE |
                                    JS_PROP_HAS_WRITABLE |
                                    JS_PROP_HAS_CONFIGURABLE |
                                    JS_PROP_C_W_E);
            JS_FreeValue(ctx, val);
            return ret;
        }
    }

    pr = add_property(ctx, p, prop, JS_PROP_C_W_E);
    if (unlikely(!pr)) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    pr->u.value = val;
    return TRUE;
}